

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiImageClearingTests.cpp
# Opt level: O3

void __thiscall
vkt::api::anon_unknown_0::ImageClearingTestInstance::ImageClearingTestInstance
          (ImageClearingTestInstance *this,Context *context,TestParams_conflict *params)

{
  VkFormat VVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar6;
  undefined4 uVar7;
  VkImage image;
  deUint64 dVar5;
  undefined4 uVar8;
  byte bVar9;
  deUint32 dVar10;
  VkImageUsageFlags VVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  VkResult result;
  VkDevice pVVar15;
  InstanceInterface *pIVar16;
  DeviceInterface *pDVar17;
  VkQueue pVVar18;
  Allocator *pAVar19;
  VkPhysicalDevice pVVar20;
  TextureFormat TVar21;
  NotSupportedError *this_00;
  VkAttachmentReference *pVVar22;
  VkAttachmentReference *pVVar23;
  bool bVar24;
  float fVar25;
  VkFormatProperties VVar26;
  VkAttachmentReference attachmentRef;
  VkSubpassDescription subpassDesc [1];
  undefined1 local_c8 [16];
  VkDevice local_b8;
  VkCommandPool VStack_b0;
  deUint32 local_a8;
  VkSubpassDescription *local_a0;
  deUint32 local_98;
  VkSubpassDependency *local_90;
  VkImageView attachmentViews [1];
  Move<vk::Handle<(vk::HandleType)17>_> local_58;
  
  (this->super_TestInstance).m_context = context;
  (this->super_TestInstance)._vptr_TestInstance =
       (_func_int **)&PTR__ImageClearingTestInstance_00cf0ab0;
  this->m_params = params;
  pVVar15 = Context::getDevice(context);
  this->m_device = pVVar15;
  pIVar16 = Context::getInstanceInterface(context);
  this->m_vki = pIVar16;
  pDVar17 = Context::getDeviceInterface(context);
  this->m_vkd = pDVar17;
  pVVar18 = Context::getUniversalQueue(context);
  this->m_queue = pVVar18;
  dVar10 = Context::getUniversalQueueFamilyIndex(context);
  this->m_queueFamilyIndex = dVar10;
  pAVar19 = Context::getDefaultAllocator(context);
  this->m_allocator = pAVar19;
  VVar1 = params->imageFormat;
  pIVar16 = this->m_vki;
  pVVar20 = Context::getPhysicalDevice((this->super_TestInstance).m_context);
  VVar26 = ::vk::getPhysicalDeviceFormatProperties(pIVar16,pVVar20,VVar1);
  bVar24 = ((undefined1  [12])VVar26 & (undefined1  [12])0x28000000000) == (undefined1  [12])0x0;
  this->m_isAttachmentFormat = !bVar24;
  if (bVar24) {
    VVar11 = 3;
  }
  else {
    bVar24 = ::vk::isDepthStencilFormat(params->imageFormat);
    VVar11 = (uint)bVar24 * 0x10 + 0x13;
  }
  this->m_imageUsageFlags = VVar11;
  VVar1 = params->imageFormat;
  TVar21 = ::vk::mapVkFormat(VVar1);
  bVar24 = (TVar21.order - D & 0xfffffffd) == 0;
  TVar21 = ::vk::mapVkFormat(VVar1);
  iVar12 = bVar24 + 4 + (uint)bVar24;
  if (1 < TVar21.order - S) {
    iVar12 = (uint)bVar24 * 2;
  }
  this->m_imageAspectFlags = iVar12 + (uint)(iVar12 == 0);
  pIVar16 = this->m_vki;
  pVVar20 = Context::getPhysicalDevice((this->super_TestInstance).m_context);
  iVar12 = (*pIVar16->_vptr_InstanceInterface[4])
                     (pIVar16,pVVar20,(ulong)this->m_params->imageFormat,
                      (ulong)this->m_params->imageType,0,(ulong)this->m_imageUsageFlags,0,
                      &this->m_imageFormatProperties);
  if (iVar12 != -0xb) {
    if (params->useSingleMipLevel == true) {
      this->m_imageMipLevels = 1;
      uVar14 = 1;
    }
    else {
      uVar14 = (params->imageExtent).width;
      uVar13 = (params->imageExtent).height;
      if (uVar13 < uVar14) {
        uVar13 = uVar14;
      }
      uVar14 = (params->imageExtent).depth;
      if (uVar13 <= uVar14) {
        uVar13 = uVar14;
      }
      uVar14 = (this->m_imageFormatProperties).maxMipLevels;
      fVar25 = logf((float)uVar13);
      uVar13 = (int)(long)(fVar25 * 1.442695) + 1;
      if (uVar14 <= uVar13) {
        uVar13 = uVar14;
      }
      this->m_imageMipLevels = uVar13;
      uVar14 = 1;
      if (1 < uVar13) {
        uVar14 = uVar13 >> 1;
      }
    }
    this->m_thresholdMipLevel = uVar14;
    ::vk::createCommandPool
              ((Move<vk::Handle<(vk::HandleType)24>_> *)local_c8,this->m_vkd,this->m_device,2,
               this->m_queueFamilyIndex,(VkAllocationCallbacks *)0x0);
    subpassDesc[0].pInputAttachments._0_4_ = SUB84(local_b8,0);
    subpassDesc[0].pInputAttachments._4_4_ = (undefined4)((ulong)local_b8 >> 0x20);
    subpassDesc[0].colorAttachmentCount = (deUint32)VStack_b0.m_internal;
    subpassDesc[0]._28_4_ = (undefined4)(VStack_b0.m_internal >> 0x20);
    subpassDesc[0].flags = local_c8._0_4_;
    subpassDesc[0].pipelineBindPoint = local_c8._4_4_;
    subpassDesc[0]._8_8_ = local_c8._8_8_;
    (this->m_commandPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device =
         local_b8;
    (this->m_commandPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator
         = (VkAllocationCallbacks *)VStack_b0.m_internal;
    (this->m_commandPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal =
         local_c8._0_8_;
    (this->m_commandPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.
    m_deviceIface = (DeviceInterface *)local_c8._8_8_;
    ::vk::allocateCommandBuffer
              ((Move<vk::VkCommandBuffer_s_*> *)local_c8,this->m_vkd,this->m_device,
               (VkCommandPool)
               (this->m_commandPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.
               m_internal,VK_COMMAND_BUFFER_LEVEL_PRIMARY);
    (this->m_commandBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_device =
         local_b8;
    (this->m_commandBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool.m_internal
         = VStack_b0.m_internal;
    (this->m_commandBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object =
         (VkCommandBuffer_s *)local_c8._0_8_;
    (this->m_commandBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_deviceIface =
         (DeviceInterface *)local_c8._8_8_;
    uVar2 = (params->imageExtent).width;
    uVar6 = (params->imageExtent).height;
    subpassDesc[0].pColorAttachments._4_4_ = (params->imageExtent).depth;
    subpassDesc[0].preserveAttachmentCount = this->m_imageUsageFlags;
    subpassDesc[0].pipelineBindPoint = SUB84(local_c8._0_8_,4);
    subpassDesc[0].flags = 0xe;
    subpassDesc[0].inputAttachmentCount = 0;
    subpassDesc[0]._12_4_ = 0;
    subpassDesc[0].pInputAttachments._0_4_ = 0;
    uVar3 = params->imageType;
    uVar7 = params->imageFormat;
    subpassDesc[0].pResolveAttachments._0_4_ = this->m_imageMipLevels;
    subpassDesc[0].pResolveAttachments._4_4_ = 1;
    subpassDesc[0].pDepthStencilAttachment._0_4_ = 1;
    subpassDesc[0].pDepthStencilAttachment._4_4_ = 0;
    subpassDesc[0]._60_4_ = 0;
    subpassDesc[0].pPreserveAttachments._0_4_ = 1;
    subpassDesc[0].pInputAttachments._4_4_ = uVar3;
    subpassDesc[0].colorAttachmentCount = uVar7;
    subpassDesc[0]._28_4_ = uVar2;
    subpassDesc[0].pColorAttachments._0_4_ = uVar6;
    ::vk::createImage((Move<vk::Handle<(vk::HandleType)9>_> *)local_c8,this->m_vkd,this->m_device,
                      (VkImageCreateInfo *)subpassDesc,(VkAllocationCallbacks *)0x0);
    subpassDesc[0].pInputAttachments._0_4_ = SUB84(local_b8,0);
    subpassDesc[0].pInputAttachments._4_4_ = (undefined4)((ulong)local_b8 >> 0x20);
    subpassDesc[0].colorAttachmentCount = (deUint32)VStack_b0.m_internal;
    subpassDesc[0]._28_4_ = (undefined4)(VStack_b0.m_internal >> 0x20);
    subpassDesc[0].flags = local_c8._0_4_;
    subpassDesc[0].pipelineBindPoint = local_c8._4_4_;
    subpassDesc[0]._8_8_ = local_c8._8_8_;
    (this->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device = local_b8
    ;
    (this->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)VStack_b0.m_internal;
    (this->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal =
         local_c8._0_8_;
    (this->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface =
         (DeviceInterface *)local_c8._8_8_;
    pAVar19 = this->m_allocator;
    image.m_internal =
         (this->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal;
    ::vk::getImageMemoryRequirements
              ((VkMemoryRequirements *)subpassDesc,this->m_vkd,this->m_device,image);
    (*pAVar19->_vptr_Allocator[3])(&this->m_imageMemory,pAVar19,subpassDesc,0);
    result = (*this->m_vkd->_vptr_DeviceInterface[0xd])
                       (this->m_vkd,this->m_device,image.m_internal,
                        (((this->m_imageMemory).
                          super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
                          m_data.ptr)->m_memory).m_internal);
    ::vk::checkResult(result,
                      "m_vkd.bindImageMemory(m_device, image, imageMemory->getMemory(), imageMemory->getOffset())"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiImageClearingTests.cpp"
                      ,0x1fe);
    bVar9 = this->m_isAttachmentFormat;
    if ((bool)bVar9 == true) {
      dVar5 = (this->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal
      ;
      subpassDesc[0].pColorAttachments._0_4_ = VK_IMAGE_TYPE_2D;
      if (params->imageType < VK_IMAGE_TYPE_LAST) {
        subpassDesc[0].pColorAttachments._0_4_ = params->imageType;
      }
      subpassDesc[0].pColorAttachments._4_4_ = params->imageFormat;
      subpassDesc[0].preserveAttachmentCount = this->m_imageAspectFlags;
      subpassDesc[0].flags = 0xf;
      subpassDesc[0].inputAttachmentCount = 0;
      subpassDesc[0]._12_4_ = 0;
      subpassDesc[0].pInputAttachments._0_4_ = 0;
      subpassDesc[0].colorAttachmentCount = (deUint32)dVar5;
      subpassDesc[0]._28_4_ = (undefined4)(dVar5 >> 0x20);
      subpassDesc[0].pResolveAttachments._0_4_ = 0;
      subpassDesc[0].pResolveAttachments._4_4_ = 0;
      subpassDesc[0].pDepthStencilAttachment._0_4_ = 0;
      subpassDesc[0].pDepthStencilAttachment._4_4_ = 0;
      subpassDesc[0]._60_4_ = 0;
      subpassDesc[0].pPreserveAttachments._0_4_ = 1;
      subpassDesc[0].pPreserveAttachments._4_4_ = 0;
      ::vk::createImageView
                ((Move<vk::Handle<(vk::HandleType)13>_> *)local_c8,this->m_vkd,this->m_device,
                 (VkImageViewCreateInfo *)subpassDesc,(VkAllocationCallbacks *)0x0);
      bVar9 = this->m_isAttachmentFormat;
    }
    else {
      local_b8 = (VkDevice)0x0;
      VStack_b0.m_internal = 0;
      local_c8._0_8_ = (VkCommandBuffer_s *)0x0;
      local_c8._8_8_ = (DeviceInterface *)0x0;
    }
    subpassDesc[0].pInputAttachments._0_4_ = SUB84(local_b8,0);
    subpassDesc[0].pInputAttachments._4_4_ = (undefined4)((ulong)local_b8 >> 0x20);
    subpassDesc[0].colorAttachmentCount = (deUint32)VStack_b0.m_internal;
    subpassDesc[0]._28_4_ = (undefined4)(VStack_b0.m_internal >> 0x20);
    subpassDesc[0].flags = local_c8._0_4_;
    subpassDesc[0].pipelineBindPoint = local_c8._4_4_;
    subpassDesc[0]._8_8_ = local_c8._8_8_;
    (this->m_imageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device =
         local_b8;
    (this->m_imageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)VStack_b0.m_internal;
    (this->m_imageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal =
         local_c8._0_8_;
    (this->m_imageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface
         = (DeviceInterface *)local_c8._8_8_;
    if ((bVar9 & 1) == 0) {
      local_58.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_device =
           (VkDevice)0x0;
      local_58.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_allocator =
           (VkAllocationCallbacks *)0x0;
      local_58.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal = 0;
      local_58.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_deviceIface =
           (DeviceInterface *)0x0;
    }
    else {
      VVar1 = params->imageFormat;
      bVar24 = ::vk::isDepthStencilFormat(VVar1);
      attachmentRef.layout = bVar24 | VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL;
      pVVar23 = (VkAttachmentReference *)0x0;
      attachmentViews[0].m_internal = (VkImageView)((ulong)VVar1 << 0x20);
      attachmentRef.attachment = 0;
      bVar24 = ::vk::isDepthStencilFormat(VVar1);
      pVVar22 = &attachmentRef;
      if (!bVar24) {
        pVVar22 = pVVar23;
        pVVar23 = &attachmentRef;
      }
      subpassDesc[0].flags = 0;
      subpassDesc[0].pipelineBindPoint = VK_PIPELINE_BIND_POINT_GRAPHICS;
      subpassDesc[0]._8_8_ = subpassDesc[0]._8_8_ & 0xffffffff00000000;
      subpassDesc[0].pInputAttachments._0_4_ = 0;
      subpassDesc[0].pInputAttachments._4_4_ = 0;
      subpassDesc[0].colorAttachmentCount = (deUint32)!bVar24;
      subpassDesc[0].pColorAttachments._0_4_ = (VkImageType)pVVar23;
      subpassDesc[0].pColorAttachments._4_4_ = (VkFormat)((ulong)pVVar23 >> 0x20);
      subpassDesc[0].pResolveAttachments._0_4_ = 0;
      subpassDesc[0].pResolveAttachments._4_4_ = 0;
      subpassDesc[0].pDepthStencilAttachment._0_4_ = SUB84(pVVar22,0);
      subpassDesc[0].pDepthStencilAttachment._4_4_ = (undefined4)((ulong)pVVar22 >> 0x20);
      subpassDesc[0].preserveAttachmentCount = 0;
      subpassDesc[0].pPreserveAttachments._0_4_ = 0;
      subpassDesc[0].pPreserveAttachments._4_4_ = 0;
      local_c8._0_4_ = 0x26;
      local_c8._8_8_ = (DeviceInterface *)0x0;
      local_b8 = (VkDevice)0x100000000;
      VStack_b0.m_internal = (deUint64)attachmentViews;
      local_a8 = 1;
      local_a0 = subpassDesc;
      local_98 = 0;
      local_90 = (VkSubpassDependency *)0x0;
      ::vk::createRenderPass
                (&local_58,this->m_vkd,this->m_device,(VkRenderPassCreateInfo *)local_c8,
                 (VkAllocationCallbacks *)0x0);
      bVar9 = this->m_isAttachmentFormat;
    }
    subpassDesc[0].pInputAttachments._4_4_ =
         (undefined4)
         ((ulong)local_58.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_device >>
         0x20);
    (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_device =
         local_58.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_device;
    (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_allocator =
         local_58.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_allocator;
    (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal =
         local_58.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal;
    (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_deviceIface
         = local_58.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_deviceIface;
    if ((bVar9 & 1) == 0) {
      local_b8 = (VkDevice)0x0;
      VStack_b0.m_internal = 0;
      local_c8._0_8_ = (VkCommandBuffer_s *)0x0;
      local_c8._8_8_ = (DeviceInterface *)0x0;
    }
    else {
      attachmentViews[0].m_internal =
           (VkImageView)
           (this->m_imageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.
           m_internal;
      dVar5 = (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.
              m_internal;
      subpassDesc[0].pResolveAttachments = (VkAttachmentReference *)attachmentViews;
      subpassDesc[0].pipelineBindPoint =
           (VkPipelineBindPoint)
           (local_58.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal >> 0x20
           );
      subpassDesc[0].flags = 0x25;
      subpassDesc[0].inputAttachmentCount = 0;
      subpassDesc[0]._12_4_ = 0;
      subpassDesc[0].pInputAttachments._0_4_ = 0;
      subpassDesc[0].colorAttachmentCount = (deUint32)dVar5;
      subpassDesc[0]._28_4_ = (undefined4)(dVar5 >> 0x20);
      subpassDesc[0].pColorAttachments._0_4_ = 1;
      uVar4 = (params->imageExtent).width;
      uVar8 = (params->imageExtent).height;
      subpassDesc[0].preserveAttachmentCount = 1;
      subpassDesc[0].pDepthStencilAttachment._0_4_ = uVar4;
      subpassDesc[0].pDepthStencilAttachment._4_4_ = uVar8;
      ::vk::createFramebuffer
                ((Move<vk::Handle<(vk::HandleType)23>_> *)local_c8,this->m_vkd,this->m_device,
                 (VkFramebufferCreateInfo *)subpassDesc,(VkAllocationCallbacks *)0x0);
    }
    (this->m_frameBuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_device =
         local_b8;
    (this->m_frameBuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_allocator
         = (VkAllocationCallbacks *)VStack_b0.m_internal;
    (this->m_frameBuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal =
         local_c8._0_8_;
    (this->m_frameBuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.
    m_deviceIface = (DeviceInterface *)local_c8._8_8_;
    return;
  }
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this_00,"Format not supported",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiImageClearingTests.cpp"
             ,0x1f6);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

ImageClearingTestInstance::ImageClearingTestInstance (Context& context, const TestParams& params)
	: TestInstance				(context)
	, m_params					(params)
	, m_device					(context.getDevice())
	, m_vki						(context.getInstanceInterface())
	, m_vkd						(context.getDeviceInterface())
	, m_queue					(context.getUniversalQueue())
	, m_queueFamilyIndex		(context.getUniversalQueueFamilyIndex())
	, m_allocator				(context.getDefaultAllocator())
	, m_isAttachmentFormat		(getIsAttachmentFormat(params.imageFormat))
	, m_imageUsageFlags			(getImageUsageFlags(params.imageFormat))
	, m_imageAspectFlags		(getImageAspectFlags(params.imageFormat))
	, m_imageFormatProperties	(getImageFormatProperties())
	, m_imageMipLevels			(params.useSingleMipLevel ? 1u : getNumMipLevels(params.imageExtent, m_imageFormatProperties.maxMipLevels))
	, m_thresholdMipLevel		(std::max(m_imageMipLevels / 2u, 1u))
	, m_commandPool				(createCommandPool(VK_COMMAND_POOL_CREATE_RESET_COMMAND_BUFFER_BIT))
	, m_commandBuffer			(allocatePrimaryCommandBuffer(*m_commandPool))

	, m_image					(createImage(params.imageType,
											 params.imageFormat,
											 params.imageExtent,
											 m_imageUsageFlags))

	, m_imageMemory				(allocateAndBindImageMemory(*m_image))
	, m_imageView				(m_isAttachmentFormat ? createImageView(*m_image,
												 getCorrespondingImageViewType(params.imageType),
												 params.imageFormat,
												 m_imageAspectFlags) : vk::Move<VkImageView>())

	, m_renderPass				(m_isAttachmentFormat ? createRenderPass(params.imageFormat) : vk::Move<vk::VkRenderPass>())
	, m_frameBuffer				(m_isAttachmentFormat ? createFrameBuffer(*m_imageView, *m_renderPass, params.imageExtent.width, params.imageExtent.height) : vk::Move<vk::VkFramebuffer>())
{
}